

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_MeshParameters::Read(ON_MeshParameters *this,ON_BinaryArchive *file)

{
  ON_SHA1_Hash *pOVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  uchar uVar5;
  uint archive_opennurbs_version;
  uchar mesher;
  int minor_version;
  uint texture_range;
  int major_version;
  int obsolete_m_bWeld;
  double obsolete_m_combine_angle;
  ON_SubDDisplayParameters subdp;
  byte local_99;
  int local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  int local_88;
  ON__INT32 local_84;
  double local_80;
  ON_SubDDisplayParameters local_78;
  
  memcpy(this,&DefaultMesh,0xe0);
  uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  *(undefined8 *)(this->m_geometry_settings_hash).m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_
  ;
  *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar2;
  *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  local_88 = 0;
  local_98 = 0;
  bVar3 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_88,&local_98);
  if (!bVar3) {
    return bVar3;
  }
  if (local_88 != 1) {
    return bVar3;
  }
  local_94 = (uint)this->m_bComputeCurvature;
  bVar3 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_94);
  this->m_bComputeCurvature = local_94 != 0;
  local_94 = (uint)this->m_bSimplePlanes;
  if (bVar3) {
    bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_94);
    this->m_bSimplePlanes = local_94 != 0;
    bVar3 = this->m_bRefine;
    local_94 = (uint)bVar3;
    if (bVar4) {
      bVar4 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_94);
      this->m_bRefine = local_94 != 0;
      bVar3 = this->m_bJaggedSeams;
      local_94 = (uint)bVar3;
      if (bVar4) {
        bVar3 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_94);
        this->m_bJaggedSeams = local_94 != 0;
        if (!bVar3) {
          return false;
        }
        bVar3 = ON_BinaryArchive::ReadInt(file,&local_84);
        if (!bVar3) {
          return false;
        }
        bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_tolerance);
        if (!bVar3) {
          return false;
        }
        bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_min_edge_length);
        if (!bVar3) {
          return false;
        }
        bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_max_edge_length);
        if (!bVar3) {
          return false;
        }
        bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_grid_aspect_ratio);
        if (!bVar3) {
          return false;
        }
        bVar3 = ON_BinaryArchive::ReadInt(file,&this->m_grid_min_count);
        if (!bVar3) {
          return false;
        }
        bVar3 = ON_BinaryArchive::ReadInt(file,&this->m_grid_max_count);
        if (!bVar3) {
          return false;
        }
        bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_grid_angle_radians);
        if (!bVar3) {
          return false;
        }
        bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_grid_amplification);
        if (!bVar3) {
          return false;
        }
        bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_refine_angle_radians);
        if (!bVar3) {
          return false;
        }
        bVar3 = ON_BinaryArchive::ReadDouble(file,&local_80);
        local_90 = (uint)this->m_face_type;
        if (!bVar3) {
          return false;
        }
        bVar3 = ON_BinaryArchive::ReadInt(file,&local_90);
        if (!bVar3) {
          return false;
        }
        pOVar1 = &this->m_geometry_settings_hash;
        if (((local_90 < 0x100) && (local_90 < 3)) && (local_90 != this->m_face_type)) {
          *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
               ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
          uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
          *(undefined8 *)pOVar1->m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
          *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar2;
          this->m_face_type = (uchar)local_90;
        }
        if (local_98 < 1) {
          return true;
        }
        local_8c = (uint)this->m_texture_range;
        bVar3 = ON_BinaryArchive::ReadInt(file,&local_8c);
        if (!bVar3) {
          return false;
        }
        if (((local_8c < 0x100) && (0xfffffffd < local_8c - 3)) &&
           (local_8c != this->m_texture_range)) {
          *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
               ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
          uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
          *(undefined8 *)pOVar1->m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
          *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar2;
          this->m_texture_range = (uchar)local_8c;
        }
        if (1 < local_98) {
          bVar3 = ON_BinaryArchive::ReadBool(file,&this->m_bCustomSettings);
          if (!bVar3) {
            return false;
          }
          bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_relative_tolerance);
          if (!bVar3) {
            return bVar3;
          }
          if (local_98 < 3) {
            return bVar3;
          }
          local_99 = this->m_mesher;
          bVar3 = ON_BinaryArchive::ReadChar(file,&local_99);
          if (!bVar3) {
            return false;
          }
          if ((local_99 < 2) && (this->m_mesher != local_99)) {
            *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
                 ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
            uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
            *(undefined8 *)pOVar1->m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
            *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar2;
            this->m_mesher = local_99;
          }
          if (local_98 < 4) {
            return true;
          }
          bVar3 = ON_BinaryArchive::ReadBool(file,&this->m_bCustomSettingsEnabled);
          if (!bVar3) {
            return bVar3;
          }
          if (4 < local_98) {
            local_78.m_progress_reporter_interval.m_t[0] =
                 ON_SubDDisplayParameters::Default.m_progress_reporter_interval.m_t[0];
            local_78.m_progress_reporter_interval.m_t[1] =
                 ON_SubDDisplayParameters::Default.m_progress_reporter_interval.m_t[1];
            local_78.m_terminator = ON_SubDDisplayParameters::Default.m_terminator;
            local_78.m_progress_reporter = ON_SubDDisplayParameters::Default.m_progress_reporter;
            local_78.m_reserved6 = ON_SubDDisplayParameters::Default.m_reserved6;
            local_78.m_reserved7 = ON_SubDDisplayParameters::Default.m_reserved7;
            local_78.m_bDisplayDensityIsAbsolute =
                 ON_SubDDisplayParameters::Default.m_bDisplayDensityIsAbsolute;
            local_78.m_display_density = ON_SubDDisplayParameters::Default.m_display_density;
            local_78.m_reserved = ON_SubDDisplayParameters::Default.m_reserved;
            local_78.m_bControlNetMesh = ON_SubDDisplayParameters::Default.m_bControlNetMesh;
            local_78.m_context = ON_SubDDisplayParameters::Default.m_context;
            local_78.m_bComputeCurvature = ON_SubDDisplayParameters::Default.m_bComputeCurvature;
            local_78.m_reserved3 = ON_SubDDisplayParameters::Default.m_reserved3;
            local_78.m_reserved4 = ON_SubDDisplayParameters::Default.m_reserved4;
            local_78.m_reserved5 = ON_SubDDisplayParameters::Default.m_reserved5;
            bVar3 = ON_SubDDisplayParameters::Read(&local_78,file);
            if (bVar3) {
              uVar5 = ON_SubDDisplayParameters::EncodeAsUnsignedChar(&local_78);
              if (uVar5 != this->m_subd_mesh_parameters_as_char) {
                *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
                     ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
                uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
                *(undefined8 *)pOVar1->m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
                *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar2;
                this->m_subd_mesh_parameters_as_char = uVar5;
              }
              archive_opennurbs_version = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
              Internal_MeshParametersRead_UpdateSubDParameters(archive_opennurbs_version,this);
              return bVar3;
            }
            return bVar3;
          }
          return bVar3;
        }
        return true;
      }
      goto LAB_004fd182;
    }
  }
  else {
    this->m_bSimplePlanes = this->m_bSimplePlanes;
    bVar3 = this->m_bRefine;
  }
  this->m_bRefine = bVar3;
  bVar3 = this->m_bJaggedSeams;
LAB_004fd182:
  this->m_bJaggedSeams = bVar3;
  return false;
}

Assistant:

bool ON_MeshParameters::Read( ON_BinaryArchive& file )
{
  *this = ON_MeshParameters::DefaultMesh;
  m_geometry_settings_hash = ON_SHA1_Hash::ZeroDigest;

  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && major_version == 1 ) 
  {
    int i;

    i = m_bComputeCurvature;
    if (rc) rc = file.ReadInt(&i);
    m_bComputeCurvature = i?true:false;

    i = m_bSimplePlanes;
    if (rc) rc = file.ReadInt(&i);
    m_bSimplePlanes = i?true:false;

    i = m_bRefine;
    if (rc) rc = file.ReadInt(&i);
    m_bRefine = i?true:false;

    i = m_bJaggedSeams;
    if (rc) rc = file.ReadInt(&i);
    m_bJaggedSeams = i?true:false;

    int obsolete_m_bWeld;
    if (rc) rc = file.ReadInt(&obsolete_m_bWeld);

    if (rc) rc = file.ReadDouble(&m_tolerance);
    if (rc) rc = file.ReadDouble(&m_min_edge_length);
    if (rc) rc = file.ReadDouble(&m_max_edge_length);
    if (rc) rc = file.ReadDouble(&m_grid_aspect_ratio);
    if (rc) rc = file.ReadInt(&m_grid_min_count);
    if (rc) rc = file.ReadInt(&m_grid_max_count);
    if (rc) rc = file.ReadDouble(&m_grid_angle_radians);
    if (rc) rc = file.ReadDouble(&m_grid_amplification);
    if (rc) rc = file.ReadDouble(&m_refine_angle_radians);
    double obsolete_m_combine_angle;
    if (rc) rc = file.ReadDouble(&obsolete_m_combine_angle);
    unsigned int face_type = FaceType();
    if (rc) rc = file.ReadInt(&face_type);
    if (rc) 
      SetFaceType(face_type);

    if ( rc && minor_version >= 1 ) 
    {
      unsigned int texture_range = TextureRange();
      rc = file.ReadInt( &texture_range );
      if (rc)
        SetTextureRange(texture_range);
      if ( rc && minor_version >= 2 )
      {
        rc = file.ReadBool(&m_bCustomSettings);
        if (rc) rc = file.ReadDouble(&m_relative_tolerance);
        if ( rc && minor_version >= 3 )
        {
          unsigned char mesher = (unsigned char)Mesher();
          rc = file.ReadChar(&mesher);
          if (rc)
            SetMesher(mesher);
          if ( rc && minor_version >= 4 )
          {
            rc = file.ReadBool(&m_bCustomSettingsEnabled);
            if (rc && minor_version >= 5)
            {
              ON_SubDDisplayParameters subdp = ON_SubDDisplayParameters::Default;
              rc = subdp.Read(file);
              if (rc)
              {
                this->SetSubDDisplayParameters(subdp);
                Internal_MeshParametersRead_UpdateSubDParameters(file.ArchiveOpenNURBSVersion(), *this);
              }
            }
          }
        }
      }
    }
  }

  return rc;
}